

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double bfrac(double *a,double *b,double *x,double *y,double *lambda,double *eps)

{
  double dVar1;
  double dVar2;
  double *eps_local;
  double *lambda_local;
  double *y_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  a_local = (double *)brcomp(a,b,x,y);
  if (((double)a_local != 0.0) || (NAN((double)a_local))) {
    bfrac::c = *lambda + 1.0;
    bfrac::c0 = *b / *a;
    bfrac::c1 = 1.0 / *a + 1.0;
    bfrac::yp1 = *y + 1.0;
    bfrac::n = 0.0;
    bfrac::p = 1.0;
    bfrac::s = *a + 1.0;
    bfrac::an = 0.0;
    bfrac::anp1 = 1.0;
    bfrac::bn = 1.0;
    bfrac::bnp1 = bfrac::c / bfrac::c1;
    bfrac::r = bfrac::c1 / bfrac::c;
    while( true ) {
      bfrac::n = bfrac::n + 1.0;
      dVar1 = bfrac::n / *a;
      bfrac::w = bfrac::n * (*b - bfrac::n) * *x;
      bfrac::alpha = bfrac::p * (bfrac::p + bfrac::c0) * (*a / bfrac::s) * (*a / bfrac::s) *
                     bfrac::w * *x;
      bfrac::e = (dVar1 + 1.0) / (bfrac::c1 + dVar1 + dVar1);
      bfrac::beta = bfrac::e * (bfrac::n * bfrac::yp1 + bfrac::c) + bfrac::n + bfrac::w / bfrac::s;
      bfrac::p = dVar1 + 1.0;
      bfrac::s = bfrac::s + 2.0;
      dVar1 = bfrac::alpha * bfrac::an + bfrac::beta * bfrac::anp1;
      bfrac::an = bfrac::anp1;
      bfrac::t = bfrac::alpha * bfrac::bn + bfrac::beta * bfrac::bnp1;
      bfrac::bn = bfrac::bnp1;
      bfrac::r0 = bfrac::r;
      dVar2 = dVar1 / bfrac::t;
      if (ABS(dVar2 - bfrac::r) <= *eps * dVar2) break;
      bfrac::an = bfrac::anp1 / bfrac::t;
      bfrac::bn = bfrac::bnp1 / bfrac::t;
      bfrac::bnp1 = 1.0;
      bfrac::anp1 = dVar2;
      bfrac::r = dVar2;
    }
    a_local = (double *)(dVar2 * (double)a_local);
    bfrac::anp1 = dVar1;
    bfrac::bnp1 = bfrac::t;
    bfrac::r = dVar2;
  }
  bfrac::bfrac = (double)a_local;
  return (double)a_local;
}

Assistant:

double bfrac(double *a,double *b,double *x,double *y,double *lambda,
             double *eps)
/*
-----------------------------------------------------------------------
     CONTINUED FRACTION EXPANSION FOR IX(A,B) WHEN A,B .GT. 1.
     IT IS ASSUMED THAT  LAMBDA = (A + B)*Y - B.
-----------------------------------------------------------------------
*/
{
static double bfrac,alpha,an,anp1,beta,bn,bnp1,c,c0,c1,e,n,p,r,r0,s,t,w,yp1;
/*
     ..
     .. Executable Statements ..
*/
    bfrac = brcomp(a,b,x,y);
    if(bfrac == 0.0e0) return bfrac;
    c = 1.0e0+*lambda;
    c0 = *b/ *a;
    c1 = 1.0e0+1.0e0/ *a;
    yp1 = *y+1.0e0;
    n = 0.0e0;
    p = 1.0e0;
    s = *a+1.0e0;
    an = 0.0e0;
    bn = anp1 = 1.0e0;
    bnp1 = c/c1;
    r = c1/c;
S10:
/*
        CONTINUED FRACTION CALCULATION
*/
    n += 1.0e0;
    t = n/ *a;
    w = n*(*b-n)**x;
    e = *a/s;
    alpha = p*(p+c0)*e*e*(w**x);
    e = (1.0e0+t)/(c1+t+t);
    beta = n+w/s+e*(c+n*yp1);
    p = 1.0e0+t;
    s += 2.0e0;
/*
        UPDATE AN, BN, ANP1, AND BNP1
*/
    t = alpha*an+beta*anp1;
    an = anp1;
    anp1 = t;
    t = alpha*bn+beta*bnp1;
    bn = bnp1;
    bnp1 = t;
    r0 = r;
    r = anp1/bnp1;
    if(fabs(r-r0) <= *eps*r) goto S20;
/*
        RESCALE AN, BN, ANP1, AND BNP1
*/
    an /= bnp1;
    bn /= bnp1;
    anp1 = r;
    bnp1 = 1.0e0;
    goto S10;
S20:
/*
                 TERMINATION
*/
    bfrac *= r;
    return bfrac;
}